

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O3

void duckdb::ModeFunction<duckdb::ModeStandard<duckdb::hugeint_t>>::
     Finalize<duckdb::hugeint_t,duckdb::ModeState<duckdb::hugeint_t,duckdb::ModeStandard<duckdb::hugeint_t>>>
               (ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_> *state,
               hugeint_t *target,AggregateFinalizeData *finalize_data)

{
  int64_t iVar1;
  const_iterator cVar2;
  
  if (state->frequency_map != (Counts *)0x0) {
    cVar2 = ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_>::Scan(state);
    if (cVar2.super__Node_iterator_base<std::pair<const_duckdb::hugeint_t,_duckdb::ModeAttr>,_true>.
        _M_cur != (__node_type *)0x0) {
      iVar1 = *(int64_t *)
               ((long)cVar2.
                      super__Node_iterator_base<std::pair<const_duckdb::hugeint_t,_duckdb::ModeAttr>,_true>
                      ._M_cur + 0x10);
      target->lower =
           *(uint64_t *)
            ((long)cVar2.
                   super__Node_iterator_base<std::pair<const_duckdb::hugeint_t,_duckdb::ModeAttr>,_true>
                   ._M_cur + 8);
      target->upper = iVar1;
      return;
    }
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (!state.frequency_map) {
			finalize_data.ReturnNull();
			return;
		}
		auto highest_frequency = state.Scan();
		if (highest_frequency != state.frequency_map->end()) {
			target = TYPE_OP::template Assign<T, T>(finalize_data.result, highest_frequency->first);
		} else {
			finalize_data.ReturnNull();
		}
	}